

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessageRecursive<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_unsigned_char>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
                   uchar params,uchar params_1)

{
  string *in_RCX;
  string *in_RDI;
  undefined4 in_R8D;
  undefined4 in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff78;
  string local_80 [30];
  uchar in_stack_ffffffffffffff9e;
  uchar in_stack_ffffffffffffff9f;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  
  ::std::__cxx11::string::string(local_80,in_RCX);
  ExceptionFormatValue::
  CreateFormatValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (in_stack_ffffffffffffff78);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            in_RCX,(value_type *)CONCAT44(in_R8D,in_stack_ffffffffffffff38));
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x2b5b433);
  ::std::__cxx11::string::~string(local_80);
  ConstructMessageRecursive<unsigned_char,_unsigned_char>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,
             in_stack_ffffffffffffff9e);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}